

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

void __thiscall google::protobuf::ServiceDescriptorProto::SharedDtor(ServiceDescriptorProto *this)

{
  string *psVar1;
  pointer pcVar2;
  ServiceOptions *this_00;
  void *pvVar3;
  LogMessage *other;
  LogMessage local_58;
  LogFinisher local_19;
  
  pvVar3 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)pvVar3 & 1) != 0) {
    pvVar3 = *(void **)((ulong)pvVar3 & 0xfffffffffffffffe);
  }
  if (pvVar3 != (void *)0x0) {
    internal::LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O3/src/src/google/protobuf/descriptor.pb.cc"
               ,0x158e);
    other = internal::LogMessage::operator<<(&local_58,"CHECK failed: GetArena() == nullptr: ");
    internal::LogFinisher::operator=(&local_19,other);
    internal::LogMessage::~LogMessage(&local_58);
  }
  psVar1 = (this->name_).ptr_;
  if (psVar1 != (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
    if ((psVar1 != (string *)0x0) &&
       (pcVar2 = (psVar1->_M_dataplus)._M_p,
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)pcVar2 != &psVar1->field_2)) {
      operator_delete(pcVar2);
    }
    operator_delete(psVar1);
  }
  if (this != (ServiceDescriptorProto *)_ServiceDescriptorProto_default_instance_) {
    this_00 = this->options_;
    if (this_00 != (ServiceOptions *)0x0) {
      ServiceOptions::~ServiceOptions(this_00);
    }
    operator_delete(this_00);
  }
  return;
}

Assistant:

void ServiceDescriptorProto::SharedDtor() {
  GOOGLE_DCHECK(GetArena() == nullptr);
  name_.DestroyNoArena(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  if (this != internal_default_instance()) delete options_;
}